

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_transaction_controller.cpp
# Opt level: O0

void __thiscall
TransactionController_VerifyInputSignature_TEST_WPKH_Test::
~TransactionController_VerifyInputSignature_TEST_WPKH_Test
          (TransactionController_VerifyInputSignature_TEST_WPKH_Test *this)

{
  void *in_RDI;
  
  ~TransactionController_VerifyInputSignature_TEST_WPKH_Test
            ((TransactionController_VerifyInputSignature_TEST_WPKH_Test *)0x23be08);
  operator_delete(in_RDI);
  return;
}

Assistant:

TEST(TransactionController, VerifyInputSignature_TEST_WPKH) {
  // input-only transaction
  std::string tx = "0200000001efcdab89674523010000000000000000000000000000000000000000000000000000000000ffffffff01406f4001000000001976a9144b8fe2da0c979ec6027dc2287e65569f41d483ec88ac00000000";
  TransactionController txc(tx);
  Privkey privkey = Privkey::GenerageRandomKey();

  // create sighash
  Txid txid("0000000000000000000000000000000000000000000000000123456789abcdef");
  uint32_t vout = 0;
  Pubkey pubkey = privkey.GeneratePubkey();
  SigHashType sighash_type(SigHashAlgorithm::kSigHashAll);
  Amount amount = Amount::CreateBySatoshiAmount(21000000);
  ByteData sighash;
  EXPECT_NO_THROW(sighash = txc.CreateSignatureHash(txid, vout, pubkey,
      sighash_type, amount, WitnessVersion::kVersion0));

  ByteData signature;
  EXPECT_NO_THROW(signature = SignatureUtil::CalculateEcSignature(
      ByteData256(sighash.GetBytes()), privkey));

  EXPECT_TRUE(txc.VerifyInputSignature(signature, pubkey, txid, vout,
      sighash_type, amount, WitnessVersion::kVersion0));
}